

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O0

void Wlc_ObjSimCo(Gia_Man_t *p,int iObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  word *pwVar2;
  word *pwVar3;
  word *pSimDri;
  word *pSimCo;
  Gia_Obj_t *pObj;
  int w;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  pwVar2 = Wlc_ObjSim(p,iObj);
  iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
  pwVar3 = Wlc_ObjSim(p,iVar1);
  iVar1 = Gia_ObjFaninC0(pObj_00);
  if (iVar1 == 0) {
    for (pObj._0_4_ = 0; (int)pObj < p->nSimWords; pObj._0_4_ = (int)pObj + 1) {
      pwVar2[(int)pObj] = pwVar3[(int)pObj];
    }
  }
  else {
    for (pObj._0_4_ = 0; (int)pObj < p->nSimWords; pObj._0_4_ = (int)pObj + 1) {
      pwVar2[(int)pObj] = pwVar3[(int)pObj] ^ 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

static inline void Wlc_ObjSimCo( Gia_Man_t * p, int iObj )
{
    int w;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    word * pSimCo  = Wlc_ObjSim( p, iObj );
    word * pSimDri = Wlc_ObjSim( p, Gia_ObjFaninId0(pObj, iObj) );
    if ( Gia_ObjFaninC0(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSimCo[w] = ~pSimDri[w];
    else
        for ( w = 0; w < p->nSimWords; w++ )
            pSimCo[w] =  pSimDri[w];
}